

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_leap_mpi.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  int rank;
  int size;
  long in;
  double local_70;
  long in_all;
  int argc_local;
  char **argv_local;
  yarn2 ry;
  yarn2 rx;
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  MPI_Comm_size(&ompi_mpi_comm_world,&size);
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  trng::yarn2::yarn2(&rx,trng::yarn2::LEcuyer1);
  trng::yarn2::yarn2(&ry,trng::yarn2::LEcuyer1);
  lVar2 = 0;
  trng::yarn2::split(&rx,2,0);
  trng::yarn2::split(&ry,2,1);
  trng::yarn2::split(&rx,size,rank);
  trng::yarn2::split(&ry,size,rank);
  in = 0;
  for (lVar3 = (long)rank; lVar3 < 1000000; lVar3 = lVar3 + size) {
    local_70 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn2>::co(&rx);
    dVar4 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn2>::co(&ry);
    if (local_70 * local_70 + dVar4 * dVar4 <= 1.0) {
      lVar2 = lVar2 + 1;
      in = lVar2;
    }
  }
  MPI_Reduce(&in,&in_all,1,&ompi_mpi_long,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  if (rank == 0) {
    std::operator<<((ostream *)&std::cout,"pi = ");
    poVar1 = std::ostream::_M_insert<double>(((double)in_all * 4.0) / 1000000.0);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  const long samples{1000000l};  // total number of points in square
  MPI_Init(&argc, &argv);        // initialize MPI environment
  int size, rank;
  MPI_Comm_size(MPI_COMM_WORLD, &size);  // get total number of processes
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);  // get rank of current process
  trng::yarn2 rx, ry;                    // random number engines for x- and y-coordinates
  // split PRN sequences by leapfrog method
  rx.split(2, 0);            // choose sub-stream no. 0 out of 2 streams
  ry.split(2, 1);            // choose sub-stream no. 1 out of 2 streams
  rx.split(size, rank);      // choose sub-stream no. rank out of size streams
  ry.split(size, rank);      // choose sub-stream no. rank out of size streams
  long in{0l};               // number of points in circle
  trng::uniform01_dist<> u;  // random number distribution
  // throw random points into square and distribute workload over all processes
  for (long i{rank}; i < samples; i += size) {
    const double x{u(rx)}, y{u(ry)};  // choose random x- and y-coordinates
    if (x * x + y * y <= 1.0)         // is point in circle?
      ++in;                           // increase counter
  }
  // calculate sum of all local variables 'in' and storre result in 'in_all' on process 0
  long in_all;
  MPI_Reduce(&in, &in_all, 1, MPI_LONG, MPI_SUM, 0, MPI_COMM_WORLD);
  if (rank == 0)  // print result
    std::cout << "pi = " << 4.0 * in_all / samples << std::endl;
  MPI_Finalize();  // quit MPI
  return EXIT_SUCCESS;
}